

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.h
# Opt level: O0

int __thiscall libchess::Position::see_to(Position *this,Square square,array<int,_6UL> piece_values)

{
  bool bVar1;
  Type TVar2;
  _Optional_payload_base<libchess::Move> this_00;
  reference pvVar3;
  PieceType *this_01;
  Move *pMVar4;
  int *piVar5;
  Square in_EDI;
  array<int,_6UL> in_stack_00000000;
  Position *in_stack_00000058;
  Move in_stack_00000064;
  Position pos;
  optional<libchess::PieceType> smallest_capture_move_prom_piece_type;
  int piece_val;
  optional<libchess::Piece> square_pt;
  bool is_enpassant;
  optional<libchess::Move> smallest_capture_move;
  Piece *in_stack_fffffffffffffeb8;
  array<int,_6UL> *in_stack_fffffffffffffec0;
  Position *this_02;
  Move *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int iVar6;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  Square square_00;
  value_type in_stack_fffffffffffffee0;
  int local_e4 [6];
  value_type local_cc;
  Position *in_stack_ffffffffffffff80;
  Square in_stack_ffffffffffffff8c;
  MetaValueType<int> local_34;
  int local_30;
  _Optional_payload_base<libchess::Piece> local_28;
  byte local_1d;
  int local_4;
  
  square_00.super_MetaValueType<int>.value_ = SUB84((ulong)in_stack_fffffffffffffed8 >> 0x20,0);
  this_00 = (_Optional_payload_base<libchess::Move>)
            smallest_capture_move_to(in_stack_ffffffffffffff80,in_stack_ffffffffffffff8c);
  bVar1 = std::optional::operator_cast_to_bool((optional<libchess::Move> *)0x135a4f);
  if (bVar1) {
    std::optional<libchess::Move>::operator->((optional<libchess::Move> *)0x135a70);
    TVar2 = Move::type((Move *)0x135a78);
    local_1d = TVar2 == ENPASSANT;
    local_28 = (_Optional_payload_base<libchess::Piece>)
               piece_on((Position *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        square_00);
    bVar1 = std::optional::operator_cast_to_bool((optional<libchess::Piece> *)0x135aba);
    if ((bVar1) || ((local_1d & 1) != 0)) {
      if ((local_1d & 1) == 0) {
        std::optional<libchess::Piece>::operator->((optional<libchess::Piece> *)0x135b05);
        local_34.value_ = (value_type)Piece::type(in_stack_fffffffffffffeb8);
        MetaValueType<int>::value(&local_34);
        pvVar3 = std::array<int,_6UL>::at
                           (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
        iVar6 = *pvVar3;
      }
      else {
        pvVar3 = std::array<int,_6UL>::at
                           (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
        iVar6 = *pvVar3;
      }
      local_30 = iVar6;
      std::optional<libchess::Move>::operator->((optional<libchess::Move> *)0x135b4c);
      Move::promotion_piece_type(in_stack_fffffffffffffec8);
      bVar1 = std::optional::operator_cast_to_bool((optional<libchess::PieceType> *)0x135b69);
      if (bVar1) {
        this_01 = std::optional<libchess::PieceType>::operator->
                            ((optional<libchess::PieceType> *)0x135b7c);
        MetaValueType<int>::value(&this_01->super_MetaValueType<int>);
        pvVar3 = std::array<int,_6UL>::at
                           (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
        in_stack_fffffffffffffee0 = *pvVar3;
        pvVar3 = std::array<int,_6UL>::at
                           (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
        local_30 = (in_stack_fffffffffffffee0 - *pvVar3) + local_30;
      }
      Position((Position *)CONCAT44(iVar6,in_stack_fffffffffffffee0),
               (Position *)&stack0xffffffffffffff38);
      pMVar4 = std::optional<libchess::Move>::operator*((optional<libchess::Move> *)0x135be0);
      local_cc = pMVar4->value_;
      make_move(in_stack_00000058,in_stack_00000064);
      local_e4[1] = 0;
      this_02 = in_stack_00000000._M_elems._16_8_;
      iVar6 = local_30;
      local_e4[0] = see_to((Position *)this_00,in_EDI,in_stack_00000000);
      local_e4[0] = iVar6 - local_e4[0];
      piVar5 = std::max<int>(local_e4 + 1,local_e4);
      local_4 = *piVar5;
      ~Position(this_02);
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

inline int Position::see_to(Square square, std::array<int, 6> piece_values) {
    auto smallest_capture_move = smallest_capture_move_to(square);
    if (!smallest_capture_move) {
        return 0;
    }
    bool is_enpassant = smallest_capture_move->type() == Move::Type::ENPASSANT;

    auto square_pt = piece_on(square);
    if (!square_pt && !is_enpassant) {
        return 0;
    }

    int piece_val = is_enpassant ? piece_values.at(0) : piece_values.at(square_pt->type().value());
    auto smallest_capture_move_prom_piece_type = smallest_capture_move->promotion_piece_type();
    if (smallest_capture_move_prom_piece_type) {
        piece_val +=
            piece_values.at(smallest_capture_move_prom_piece_type->value()) - piece_values.at(0);
    }
    Position pos = *this;
    pos.make_move(*smallest_capture_move);
    return std::max(0, piece_val - pos.see_to(square, piece_values));
}